

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CTandCTOTReadCoder(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *__return_storage_ptr__,string *reference,string *sequence,
                    vector<int,_std::allocator<int>_> *qualityList,char char1,char char2,char char3)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  pointer pcVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  long *plVar8;
  undefined8 *puVar9;
  ulong uVar10;
  size_type *psVar11;
  size_type sVar12;
  char *__end;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  undefined3 in_register_00000089;
  uint __uval_2;
  uint __uval;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string codedReadQualities;
  string codedRead;
  byte local_105;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [20];
  undefined4 local_bc;
  string *local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  ulong local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_88;
  string *local_80;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  vector<int,_std::allocator<int>_> *local_38;
  
  local_bc = CONCAT31(in_register_00000089,char2);
  local_58 = local_48;
  local_80 = reference;
  local_38 = qualityList;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"","");
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"","");
  sVar12 = sequence->_M_string_length;
  if (sVar12 == 2) {
LAB_001622d3:
    paVar2 = &local_100.field_2;
    local_100._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_100,'\x01');
    std::__detail::__to_chars_10_impl<unsigned_int>(local_100._M_dataplus._M_p,1,2);
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_100._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    local_100._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_100,'\x01');
    std::__detail::__to_chars_10_impl<unsigned_int>(local_100._M_dataplus._M_p,1,2);
    std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_100._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == paVar2) goto LAB_0016304e;
  }
  else {
    uVar18 = 0;
    uVar10 = 0;
    uVar15 = 0;
    local_b8 = sequence;
    local_88 = __return_storage_ptr__;
    do {
      uVar19 = uVar18;
      if (sVar12 <= uVar18) goto LAB_00163121;
      uVar16 = uVar15 + 1;
      pcVar4 = (sequence->_M_dataplus)._M_p;
      if (pcVar4[uVar18] != char1) goto LAB_00162886;
      lVar17 = (long)(int)uVar10;
      uVar13 = lVar17 + 1;
      uVar19 = uVar13;
      if (sVar12 <= uVar13) goto LAB_00163121;
      cVar3 = (char)((int)uVar15 >> 0x1f);
      sequence = local_b8;
      if (pcVar4[uVar13] == (char)local_bc) {
        uVar19 = lVar17 + 2;
        if (sVar12 <= uVar19) goto LAB_00163121;
        if (pcVar4[uVar19] == char1) goto LAB_001623ea;
        uVar19 = uVar13;
        if (local_80->_M_string_length <= uVar13) goto LAB_00163121;
        pcVar4 = (local_80->_M_dataplus)._M_p;
        if (pcVar4[uVar13] != (char)local_bc) goto LAB_00162db6;
        uVar19 = uVar18;
        if (local_80->_M_string_length <= uVar18) goto LAB_00163121;
        if (pcVar4[uVar18] != char1) goto LAB_00162db6;
        if (uVar15 != 0) {
          uVar16 = -uVar15;
          if (0 < (int)uVar15) {
            uVar16 = uVar15;
          }
          uVar14 = 1;
          if (9 < uVar16) {
            uVar10 = (ulong)uVar16;
            uVar7 = 4;
            do {
              uVar14 = uVar7;
              uVar6 = (uint)uVar10;
              if (uVar6 < 100) {
                uVar14 = uVar14 - 2;
                goto LAB_00162573;
              }
              if (uVar6 < 1000) {
                uVar14 = uVar14 - 1;
                goto LAB_00162573;
              }
              if (uVar6 < 10000) goto LAB_00162573;
              uVar10 = uVar10 / 10000;
              uVar7 = uVar14 + 4;
            } while (99999 < uVar6);
            uVar14 = uVar14 + 1;
          }
LAB_00162573:
          local_b0[0] = local_a0;
          std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar14 - cVar3);
          local_90 = (ulong)(uVar15 >> 0x1f);
          std::__detail::__to_chars_10_impl<unsigned_int>(local_b0[0] + local_90,uVar14,uVar16);
          plVar8 = (long *)std::__cxx11::string::append((char *)local_b0);
          psVar11 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_100.field_2._M_allocated_capacity = *psVar11;
            local_100.field_2._8_8_ = plVar8[3];
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          }
          else {
            local_100.field_2._M_allocated_capacity = *psVar11;
            local_100._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_100._M_string_length = plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_100._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p);
          }
          if (local_b0[0] != local_a0) {
            operator_delete(local_b0[0]);
          }
          uVar15 = 1;
          if (9 < uVar16) {
            uVar10 = (ulong)uVar16;
            uVar14 = 4;
            do {
              uVar15 = uVar14;
              uVar7 = (uint)uVar10;
              if (uVar7 < 100) {
                uVar15 = uVar15 - 2;
                goto LAB_0016268b;
              }
              if (uVar7 < 1000) {
                uVar15 = uVar15 - 1;
                goto LAB_0016268b;
              }
              if (uVar7 < 10000) goto LAB_0016268b;
              uVar10 = uVar10 / 10000;
              uVar14 = uVar15 + 4;
            } while (99999 < uVar7);
            uVar15 = uVar15 + 1;
          }
LAB_0016268b:
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar15 - cVar3);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_100._M_dataplus._M_p + local_90,uVar15,uVar16);
          std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_100._M_dataplus._M_p);
          goto LAB_00162841;
        }
LAB_0016255a:
        std::__cxx11::string::append((char *)&local_58);
LAB_0016285d:
        std::__cxx11::string::push_back((char)&local_78);
        uVar16 = 0;
        uVar10 = uVar13 & 0xffffffff;
        sequence = local_b8;
LAB_00162886:
        uVar13 = (ulong)(int)uVar10;
        uVar18 = sequence->_M_string_length;
        if (uVar18 - 3 <= uVar13) {
          uVar10 = uVar13 + 1;
          if (uVar18 - 2 == uVar10) {
            uVar19 = uVar10;
            if (uVar18 <= uVar10) goto LAB_00163121;
            pcVar4 = (sequence->_M_dataplus)._M_p;
            local_105 = 1;
            if (pcVar4[uVar10] == char1) {
              uVar1 = uVar13 + 2;
              uVar19 = uVar1;
              if (uVar18 <= uVar1) goto LAB_00163121;
              cVar3 = pcVar4[uVar1];
              cVar5 = (char)((int)uVar16 >> 0x1f);
              if (cVar3 == (char)local_bc) {
                uVar19 = uVar13 + 3;
                uVar18 = local_80->_M_string_length;
                if (uVar18 <= uVar19) goto LAB_00163121;
                pcVar4 = (local_80->_M_dataplus)._M_p;
                if (pcVar4[uVar19] == char1) goto LAB_0016290c;
                uVar19 = uVar1;
                if (uVar18 <= uVar1) goto LAB_00163121;
                if (pcVar4[uVar1] != (char)local_bc) goto LAB_00162f27;
                uVar19 = uVar10;
                if (uVar18 <= uVar10) goto LAB_00163121;
                if (pcVar4[uVar10] != char1) goto LAB_00162f27;
                if (uVar16 != 0) {
                  uVar15 = -uVar16;
                  if (0 < (int)uVar16) {
                    uVar15 = uVar16;
                  }
                  uVar14 = 1;
                  if (9 < uVar15) {
                    uVar10 = (ulong)uVar15;
                    uVar7 = 4;
                    do {
                      uVar14 = uVar7;
                      uVar6 = (uint)uVar10;
                      if (uVar6 < 100) {
                        uVar14 = uVar14 - 2;
                        goto LAB_00162a97;
                      }
                      if (uVar6 < 1000) {
                        uVar14 = uVar14 - 1;
                        goto LAB_00162a97;
                      }
                      if (uVar6 < 10000) goto LAB_00162a97;
                      uVar10 = uVar10 / 10000;
                      uVar7 = uVar14 + 4;
                    } while (99999 < uVar6);
                    uVar14 = uVar14 + 1;
                  }
LAB_00162a97:
                  local_b0[0] = local_a0;
                  std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar14 - cVar5);
                  local_90 = (ulong)(uVar16 >> 0x1f);
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            (local_b0[0] + local_90,uVar14,uVar15);
                  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)local_b0);
                  psVar11 = puVar9 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar9 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar11) {
                    local_100.field_2._M_allocated_capacity = *psVar11;
                    local_100.field_2._8_8_ = puVar9[3];
                    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                  }
                  else {
                    local_100.field_2._M_allocated_capacity = *psVar11;
                    local_100._M_dataplus._M_p = (pointer)*puVar9;
                  }
                  local_100._M_string_length = puVar9[1];
                  *puVar9 = psVar11;
                  puVar9[1] = 0;
                  *(undefined1 *)(puVar9 + 2) = 0;
                  std::__cxx11::string::_M_append
                            ((char *)&local_58,(ulong)local_100._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_100._M_dataplus._M_p != &local_100.field_2) {
                    operator_delete(local_100._M_dataplus._M_p);
                  }
                  if (local_b0[0] != local_a0) {
                    operator_delete(local_b0[0]);
                  }
                  uVar16 = 1;
                  if (9 < uVar15) {
                    uVar10 = (ulong)uVar15;
                    uVar14 = 4;
                    do {
                      uVar16 = uVar14;
                      uVar7 = (uint)uVar10;
                      if (uVar7 < 100) {
                        uVar16 = uVar16 - 2;
                        goto LAB_00162bb3;
                      }
                      if (uVar7 < 1000) {
                        uVar16 = uVar16 - 1;
                        goto LAB_00162bb3;
                      }
                      if (uVar7 < 10000) goto LAB_00162bb3;
                      uVar10 = uVar10 / 10000;
                      uVar14 = uVar16 + 4;
                    } while (99999 < uVar7);
                    uVar16 = uVar16 + 1;
                  }
LAB_00162bb3:
                  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                  std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar16 - cVar5);
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            (local_100._M_dataplus._M_p + local_90,uVar16,uVar15);
                  std::__cxx11::string::_M_append
                            ((char *)&local_78,(ulong)local_100._M_dataplus._M_p);
                  goto LAB_00162d6f;
                }
LAB_00162a7e:
                std::__cxx11::string::append((char *)&local_58);
LAB_00162d8b:
                std::__cxx11::string::push_back((char)&local_78);
                uVar16 = 0xffffffff;
                uVar10 = uVar1 & 0xffffffff;
                sequence = local_b8;
              }
              else {
LAB_0016290c:
                if (cVar3 == char3) {
                  uVar19 = uVar13 + 3;
                  uVar18 = local_80->_M_string_length;
                  if (uVar18 <= uVar19) {
LAB_00163121:
                    std::__throw_out_of_range_fmt
                              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar19);
                  }
                  pcVar4 = (local_80->_M_dataplus)._M_p;
                  if (pcVar4[uVar19] != char1) {
                    uVar19 = uVar1;
                    if (uVar18 <= uVar1) goto LAB_00163121;
                    if (pcVar4[uVar1] == (char)local_bc) {
                      uVar19 = uVar10;
                      if (uVar18 <= uVar10) goto LAB_00163121;
                      if (pcVar4[uVar10] == char1) {
                        if (uVar16 == 0) goto LAB_00162a7e;
                        uVar15 = -uVar16;
                        if (0 < (int)uVar16) {
                          uVar15 = uVar16;
                        }
                        uVar14 = 1;
                        if (9 < uVar15) {
                          uVar10 = (ulong)uVar15;
                          uVar7 = 4;
                          do {
                            uVar14 = uVar7;
                            uVar6 = (uint)uVar10;
                            if (uVar6 < 100) {
                              uVar14 = uVar14 - 2;
                              goto LAB_00162c09;
                            }
                            if (uVar6 < 1000) {
                              uVar14 = uVar14 - 1;
                              goto LAB_00162c09;
                            }
                            if (uVar6 < 10000) goto LAB_00162c09;
                            uVar10 = uVar10 / 10000;
                            uVar7 = uVar14 + 4;
                          } while (99999 < uVar6);
                          uVar14 = uVar14 + 1;
                        }
LAB_00162c09:
                        local_b0[0] = local_a0;
                        std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar14 - cVar5);
                        local_90 = (ulong)(uVar16 >> 0x1f);
                        std::__detail::__to_chars_10_impl<unsigned_int>
                                  (local_b0[0] + local_90,uVar14,uVar15);
                        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)local_b0);
                        psVar11 = puVar9 + 2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*puVar9 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar11) {
                          local_100.field_2._M_allocated_capacity = *psVar11;
                          local_100.field_2._8_8_ = puVar9[3];
                          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                        }
                        else {
                          local_100.field_2._M_allocated_capacity = *psVar11;
                          local_100._M_dataplus._M_p = (pointer)*puVar9;
                        }
                        local_100._M_string_length = puVar9[1];
                        *puVar9 = psVar11;
                        puVar9[1] = 0;
                        *(undefined1 *)(puVar9 + 2) = 0;
                        std::__cxx11::string::_M_append
                                  ((char *)&local_58,(ulong)local_100._M_dataplus._M_p);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_100._M_dataplus._M_p != &local_100.field_2) {
                          operator_delete(local_100._M_dataplus._M_p);
                        }
                        if (local_b0[0] != local_a0) {
                          operator_delete(local_b0[0]);
                        }
                        uVar16 = 1;
                        if (9 < uVar15) {
                          uVar10 = (ulong)uVar15;
                          uVar14 = 4;
                          do {
                            uVar16 = uVar14;
                            uVar7 = (uint)uVar10;
                            if (uVar7 < 100) {
                              uVar16 = uVar16 - 2;
                              goto LAB_00162d25;
                            }
                            if (uVar7 < 1000) {
                              uVar16 = uVar16 - 1;
                              goto LAB_00162d25;
                            }
                            if (uVar7 < 10000) goto LAB_00162d25;
                            uVar10 = uVar10 / 10000;
                            uVar14 = uVar16 + 4;
                          } while (99999 < uVar7);
                          uVar16 = uVar16 + 1;
                        }
LAB_00162d25:
                        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                        std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar16 - cVar5);
                        std::__detail::__to_chars_10_impl<unsigned_int>
                                  (local_100._M_dataplus._M_p + local_90,uVar16,uVar15);
                        std::__cxx11::string::_M_append
                                  ((char *)&local_78,(ulong)local_100._M_dataplus._M_p);
LAB_00162d6f:
                        __return_storage_ptr__ = local_88;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_100._M_dataplus._M_p != &local_100.field_2) {
                          operator_delete(local_100._M_dataplus._M_p);
                        }
                        goto LAB_00162d8b;
                      }
                    }
LAB_00162f27:
                    local_105 = 1;
                    break;
                  }
                }
              }
            }
          }
          else {
            local_105 = local_105 & uVar18 - 1 != uVar10;
          }
        }
      }
      else {
LAB_001623ea:
        if (pcVar4[uVar13] != char3) goto LAB_00162886;
        uVar19 = lVar17 + 2;
        if (sVar12 <= uVar19) goto LAB_00163121;
        if (pcVar4[uVar19] == char1) goto LAB_00162886;
        uVar19 = uVar13;
        if (local_80->_M_string_length <= uVar13) goto LAB_00163121;
        pcVar4 = (local_80->_M_dataplus)._M_p;
        if (pcVar4[uVar13] == (char)local_bc) {
          uVar19 = uVar18;
          if (local_80->_M_string_length <= uVar18) goto LAB_00163121;
          if (pcVar4[uVar18] == char1) {
            if (uVar15 == 0) goto LAB_0016255a;
            uVar16 = -uVar15;
            if (0 < (int)uVar15) {
              uVar16 = uVar15;
            }
            uVar14 = 1;
            if (9 < uVar16) {
              uVar10 = (ulong)uVar16;
              uVar7 = 4;
              do {
                uVar14 = uVar7;
                uVar6 = (uint)uVar10;
                if (uVar6 < 100) {
                  uVar14 = uVar14 - 2;
                  goto LAB_001626e0;
                }
                if (uVar6 < 1000) {
                  uVar14 = uVar14 - 1;
                  goto LAB_001626e0;
                }
                if (uVar6 < 10000) goto LAB_001626e0;
                uVar10 = uVar10 / 10000;
                uVar7 = uVar14 + 4;
              } while (99999 < uVar6);
              uVar14 = uVar14 + 1;
            }
LAB_001626e0:
            local_b0[0] = local_a0;
            std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar14 - cVar3);
            local_90 = (ulong)(uVar15 >> 0x1f);
            std::__detail::__to_chars_10_impl<unsigned_int>(local_b0[0] + local_90,uVar14,uVar16);
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)local_b0);
            psVar11 = puVar9 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_100.field_2._M_allocated_capacity = *psVar11;
              local_100.field_2._8_8_ = puVar9[3];
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            }
            else {
              local_100.field_2._M_allocated_capacity = *psVar11;
              local_100._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_100._M_string_length = puVar9[1];
            *puVar9 = psVar11;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_100._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p);
            }
            if (local_b0[0] != local_a0) {
              operator_delete(local_b0[0]);
            }
            uVar15 = 1;
            if (9 < uVar16) {
              uVar10 = (ulong)uVar16;
              uVar14 = 4;
              do {
                uVar15 = uVar14;
                uVar7 = (uint)uVar10;
                if (uVar7 < 100) {
                  uVar15 = uVar15 - 2;
                  goto LAB_001627f8;
                }
                if (uVar7 < 1000) {
                  uVar15 = uVar15 - 1;
                  goto LAB_001627f8;
                }
                if (uVar7 < 10000) goto LAB_001627f8;
                uVar10 = uVar10 / 10000;
                uVar14 = uVar15 + 4;
              } while (99999 < uVar7);
              uVar15 = uVar15 + 1;
            }
LAB_001627f8:
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar15 - cVar3);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_100._M_dataplus._M_p + local_90,uVar15,uVar16);
            std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_100._M_dataplus._M_p);
LAB_00162841:
            __return_storage_ptr__ = local_88;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p);
            }
            goto LAB_0016285d;
          }
        }
      }
LAB_00162db6:
      uVar15 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar15;
      uVar18 = (ulong)(int)uVar15;
      sVar12 = sequence->_M_string_length;
      uVar15 = uVar16;
    } while (uVar18 < sVar12 - 2);
    if (uVar16 - 1 < 0xfffffffe) {
      uVar16 = uVar16 + 2;
      uVar15 = -uVar16;
      if (0 < (int)uVar16) {
        uVar15 = uVar16;
      }
      uVar14 = 1;
      if (9 < uVar15) {
        uVar10 = (ulong)uVar15;
        uVar7 = 4;
        do {
          uVar14 = uVar7;
          uVar6 = (uint)uVar10;
          if (uVar6 < 100) {
            uVar14 = uVar14 - 2;
            goto LAB_00162f3a;
          }
          if (uVar6 < 1000) {
            uVar14 = uVar14 - 1;
            goto LAB_00162f3a;
          }
          if (uVar6 < 10000) goto LAB_00162f3a;
          uVar10 = uVar10 / 10000;
          uVar7 = uVar14 + 4;
        } while (99999 < uVar6);
        uVar14 = uVar14 + 1;
      }
LAB_00162f3a:
      cVar3 = (char)((int)uVar16 >> 0x1f);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar14 - cVar3);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_100._M_dataplus._M_p + (uVar16 >> 0x1f),uVar14,uVar15);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_100._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      uVar14 = 1;
      if (9 < uVar15) {
        uVar10 = (ulong)uVar15;
        uVar7 = 4;
        do {
          uVar14 = uVar7;
          uVar6 = (uint)uVar10;
          if (uVar6 < 100) {
            uVar14 = uVar14 - 2;
            goto LAB_00162fdd;
          }
          if (uVar6 < 1000) {
            uVar14 = uVar14 - 1;
            goto LAB_00162fdd;
          }
          if (uVar6 < 10000) goto LAB_00162fdd;
          uVar10 = uVar10 / 10000;
          uVar7 = uVar14 + 4;
        } while (99999 < uVar6);
        uVar14 = uVar14 + 1;
      }
LAB_00162fdd:
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar14 - cVar3);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_100._M_dataplus._M_p + (uVar16 >> 0x1f),uVar14,uVar15);
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_100._M_dataplus._M_p);
      __return_storage_ptr__ = local_88;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p == &local_100.field_2) goto LAB_0016304e;
    }
    else {
      if (uVar16 == 0xffffffff) goto LAB_0016304e;
      if ((local_105 & 1) != 0) goto LAB_001622d3;
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_100,'\x01');
      std::__detail::__to_chars_10_impl<unsigned_int>(local_100._M_dataplus._M_p,1,1);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_100._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_100,'\x01');
      std::__detail::__to_chars_10_impl<unsigned_int>(local_100._M_dataplus._M_p,1,1);
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_100._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p == &local_100.field_2) goto LAB_0016304e;
    }
  }
  operator_delete(local_100._M_dataplus._M_p);
LAB_0016304e:
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_100,local_58,local_58 + local_50);
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char*>((string *)local_e0,local_78,local_78 + local_70);
  __l._M_len = 2;
  __l._M_array = &local_100;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__l,(allocator_type *)local_b0);
  lVar17 = 0;
  do {
    if (local_d0 + lVar17 != *(undefined1 **)((long)local_e0 + lVar17)) {
      operator_delete(*(undefined1 **)((long)local_e0 + lVar17));
    }
    lVar17 = lVar17 + -0x20;
  } while (lVar17 != -0x40);
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<string> CTandCTOTReadCoder(string reference,string sequence,vector<int> qualityList,char char1,char char2,char char3){

    string codedRead = "";
    string codedReadQualities = "";
    bool endChecker;
    int counter = 0;

    for(int i =0; i<sequence.size()-2 ; i++){
        counter ++;
        if((sequence.at(i)==char1) && (sequence.at(i+1)==char2) && (sequence.at(i+2)!=char1)){
            if(reference.at(i+1)!=char2 || reference.at(i)!=char1){
                continue;
            }

            if(counter == 1){
                codedRead += "O";
                codedReadQualities += static_cast<char> (qualityList[i+1]);
            }else{
                codedRead += std::to_string(counter-1) + "O";
                codedReadQualities += std::to_string(counter-1);
                codedReadQualities += static_cast<char> (qualityList[i+1]);
            }
            i += 1;
            counter = 0;
        }else if((sequence.at(i)==char1) && (sequence.at(i+1)==char3) && (sequence.at(i+2)!=char1)){
            if(reference.at(i+1)!=char2 || reference.at(i)!=char1){
                continue;
            }
            if(counter == 1){
                codedRead += "C";
                codedReadQualities += static_cast<char> (qualityList[i+1]);
            }else{
                codedRead += std::to_string(counter-1) + "C";
                codedReadQualities += std::to_string(counter-1);
                codedReadQualities += static_cast<char> (qualityList[i+1]);
            }

            i += 1;
            counter = 0;
        }
        //This portion is specifically for calculating the last three nucleotides in the read sequence
        if(i>=sequence.size()-3){
            i++;
            if(i==sequence.size()-2){
                endChecker = true;
                if((sequence.at(i)==char1) && (sequence.at(i+1)==char2) && (reference.at(i+2)!=char1)){
                    counter++;
                    if(reference.at(i+1)!=char2 || reference.at(i)!=char1){
                        counter-=1;
                        break;
                    }
                    if(counter == 1){
                        codedRead += "O";
                        codedReadQualities += static_cast<char> (qualityList[i+1]);
                    }else{
                        codedRead += std::to_string(counter-1) + "O";
                        codedReadQualities += std::to_string(counter-1);
                        codedReadQualities += static_cast<char> (qualityList[i+1]);
                    }
                    i += 1;
                    counter = -1;

                }else if((sequence.at(i)==char1) && (sequence.at(i+1)==char3) && (reference.at(i+2)!=char1)){
                    counter++;
                    if(reference.at(i+1)!=char2|| reference.at(i)!=char1){
                        counter-=1;
                        break;
                    }
                    if(counter == 1){
                        codedRead += "C";
                        codedReadQualities += static_cast<char> (qualityList[i+1]);
                    }else{
                        codedRead += std::to_string(counter-1) + "C";
                        codedReadQualities += std::to_string(counter-1);
                        codedReadQualities += static_cast<char> (qualityList[i+1]);
                    }

                    i += 1;
                    counter = -1;
                }

            }else if(i==sequence.size()-1){
                endChecker = false;
            }
        }

    }
    if(counter!=0 && counter!=-1){
        codedRead += std::to_string(counter+2);
        codedReadQualities += std::to_string(counter+2);
    }else if(counter!=-1){
        if(endChecker){
            codedRead += std::to_string(counter+2);
            codedReadQualities += std::to_string(counter+2);
        }else{
            codedRead += std::to_string(counter+1);
            codedReadQualities += std::to_string(counter+1);
        }
    }

    return {codedRead,codedReadQualities};

}